

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_tail_multiple_seq_cst.h
# Opt level: O2

ControlBlock * __thiscall
density::detail::
LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
::create_initial_page
          (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
           *this,LfQueue_ProgressGuarantee i_progress_guarantee)

{
  bool bVar1;
  ControlBlock *pCVar2;
  ControlBlock *initial_page;
  
  pCVar2 = create_page(this,i_progress_guarantee);
  if (pCVar2 == (ControlBlock *)0x0) {
    pCVar2 = (ControlBlock *)0x0;
  }
  else {
    initial_page = (ControlBlock *)0x0;
    bVar1 = std::atomic<density::detail::LfQueueControl_*>::compare_exchange_strong
                      (&this->m_initial_page,&initial_page,pCVar2,memory_order_seq_cst);
    if (!bVar1) {
      discard_created_page(this,pCVar2);
      pCVar2 = initial_page;
    }
    initial_page = pCVar2;
    LOCK();
    pCVar2 = (ControlBlock *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
    bVar1 = pCVar2 == (ControlBlock *)0xffc0;
    if (bVar1) {
      (this->m_tail).super___atomic_base<unsigned_long>._M_i = (__int_type)initial_page;
      pCVar2 = (ControlBlock *)0xffc0;
    }
    UNLOCK();
    if (bVar1) {
      pCVar2 = initial_page;
    }
  }
  return pCVar2;
}

Assistant:

DENSITY_NO_INLINE ControlBlock *
                              create_initial_page(LfQueue_ProgressGuarantee i_progress_guarantee)
            {
                // m_initial_page = initial_page = create_page()
                auto const first_page = create_page(i_progress_guarantee);
                if (first_page == nullptr)
                {
                    return nullptr;
                }

                /* note: in case of failure of the following CAS we do not give in even if we are wait-free,
                    because this is a one-shot operation, so we can't possibly stick in a loop. */
                ControlBlock * initial_page = nullptr;
                if (m_initial_page.compare_exchange_strong(initial_page, first_page))
                {
                    initial_page = first_page;
                }
                else
                {
                    discard_created_page(first_page);
                }

                // m_tail = initial_page;
                auto tail = s_invalid_control_block;
                if (m_tail.compare_exchange_strong(tail, reinterpret_cast<uintptr_t>(initial_page)))
                {
                    return initial_page;
                }
                else
                {
                    return reinterpret_cast<ControlBlock *>(tail);
                }
            }